

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * pushnexttemplate(lua_State *L,char *path)

{
  size_t sVar1;
  lua_State *local_28;
  char *l;
  char *path_local;
  lua_State *L_local;
  
  for (l = path; *l == ';'; l = l + 1) {
  }
  if (*l == '\0') {
    L_local = (lua_State *)0x0;
  }
  else {
    local_28 = (lua_State *)strchr(l,0x3b);
    if (local_28 == (lua_State *)0x0) {
      sVar1 = strlen(l);
      local_28 = (lua_State *)(l + sVar1);
    }
    lua_pushlstring(L,l,(long)local_28 - (long)l);
    L_local = local_28;
  }
  return (char *)L_local;
}

Assistant:

static const char *pushnexttemplate(lua_State *L, const char *path)
{
  const char *l;
  while (*path == *LUA_PATHSEP) path++;  /* skip separators */
  if (*path == '\0') return NULL;  /* no more templates */
  l = strchr(path, *LUA_PATHSEP);  /* find next separator */
  if (l == NULL) l = path + strlen(path);
  lua_pushlstring(L, path, (size_t)(l - path));  /* template */
  return l;
}